

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O2

LexToken lex_scan(LexState *ls,TValue *tv)

{
  SBuf *sb;
  char *pcVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  GCstr *pGVar7;
  char *pcVar8;
  byte bVar9;
  ErrMsg em;
  LexToken tok;
  ulong uVar10;
  
  sb = &ls->sb;
  (ls->sb).w = (ls->sb).b;
LAB_00145719:
  do {
    uVar3 = ls->c;
    uVar10 = (ulong)(int)uVar3;
    if ((char)""[uVar10 + 1] < '\0') {
      if ((""[uVar10 + 1] & 8) == 0) {
        do {
          pcVar8 = (ls->sb).w;
          if (*(int *)&(ls->sb).e == (int)pcVar8) {
            pcVar8 = lj_buf_more2(sb,1);
          }
          *pcVar8 = (char)uVar10;
          (ls->sb).w = pcVar8 + 1;
          pbVar6 = (byte *)ls->p;
          if (pbVar6 < ls->pe) {
            ls->p = (char *)(pbVar6 + 1);
            uVar10 = (ulong)*pbVar6;
          }
          else {
            uVar3 = lex_more(ls);
            uVar10 = (ulong)uVar3;
          }
          ls->c = (int)uVar10;
        } while ((char)""[(long)(int)uVar10 + 1] < '\0');
        pcVar8 = (ls->sb).b;
        pGVar7 = lj_parse_keepstr(ls,pcVar8,(ulong)(uint)(*(int *)&(ls->sb).w - (int)pcVar8));
        tv->u64 = (ulong)pGVar7 | 0xfffd800000000000;
        if (pGVar7->reserved == 0) {
          return 0x11f;
        }
        return pGVar7->reserved | 0x100;
      }
LAB_001461c6:
      lex_number(ls,tv);
      return 0x11e;
    }
    if ((uVar3 - 0xb < 2) || (uVar3 == 9)) {
LAB_0014576d:
      pbVar6 = (byte *)ls->p;
      if (pbVar6 < ls->pe) {
        ls->p = (char *)(pbVar6 + 1);
        uVar3 = (uint)*pbVar6;
      }
      else {
        uVar3 = lex_more(ls);
      }
      ls->c = uVar3;
      goto LAB_00145719;
    }
    if ((uVar3 != 10) && (uVar3 != 0xd)) {
      if (uVar3 == 0x20) goto LAB_0014576d;
      if (uVar3 != 0x2d) {
        switch(uVar3) {
        case 0x3a:
          pbVar6 = (byte *)ls->p;
          if (pbVar6 < ls->pe) {
            ls->p = (char *)(pbVar6 + 1);
            uVar3 = (uint)*pbVar6;
          }
          else {
            uVar3 = lex_more(ls);
          }
          ls->c = uVar3;
          if (uVar3 == 0x3a) {
            pbVar6 = (byte *)ls->p;
            if (pbVar6 < ls->pe) {
              ls->p = (char *)(pbVar6 + 1);
              uVar3 = (uint)*pbVar6;
            }
            else {
              uVar3 = lex_more(ls);
            }
            ls->c = uVar3;
            return 0x11d;
          }
          return 0x3a;
        case 0x3b:
          goto switchD_00145914_caseD_3b;
        case 0x3c:
          pbVar6 = (byte *)ls->p;
          if (pbVar6 < ls->pe) {
            ls->p = (char *)(pbVar6 + 1);
            uVar3 = (uint)*pbVar6;
          }
          else {
            uVar3 = lex_more(ls);
          }
          ls->c = uVar3;
          if (uVar3 == 0x3d) {
            pbVar6 = (byte *)ls->p;
            if (pbVar6 < ls->pe) {
              ls->p = (char *)(pbVar6 + 1);
              uVar3 = (uint)*pbVar6;
            }
            else {
              uVar3 = lex_more(ls);
            }
            ls->c = uVar3;
            return 0x11b;
          }
          return 0x3c;
        case 0x3d:
          pbVar6 = (byte *)ls->p;
          if (pbVar6 < ls->pe) {
            ls->p = (char *)(pbVar6 + 1);
            uVar3 = (uint)*pbVar6;
          }
          else {
            uVar3 = lex_more(ls);
          }
          ls->c = uVar3;
          if (uVar3 == 0x3d) {
            pbVar6 = (byte *)ls->p;
            if (pbVar6 < ls->pe) {
              ls->p = (char *)(pbVar6 + 1);
              uVar3 = (uint)*pbVar6;
            }
            else {
              uVar3 = lex_more(ls);
            }
            ls->c = uVar3;
            return 0x119;
          }
          return 0x3d;
        case 0x3e:
          pbVar6 = (byte *)ls->p;
          if (pbVar6 < ls->pe) {
            ls->p = (char *)(pbVar6 + 1);
            uVar3 = (uint)*pbVar6;
          }
          else {
            uVar3 = lex_more(ls);
          }
          ls->c = uVar3;
          if (uVar3 == 0x3d) {
            pbVar6 = (byte *)ls->p;
            if (pbVar6 < ls->pe) {
              ls->p = (char *)(pbVar6 + 1);
              uVar3 = (uint)*pbVar6;
            }
            else {
              uVar3 = lex_more(ls);
            }
            ls->c = uVar3;
            return 0x11a;
          }
          return 0x3e;
        default:
          if (uVar3 == 0xffffffff) {
            return 0x121;
          }
          if ((uVar3 == 0x22) || (uVar3 == 0x27)) {
            pcVar8 = (ls->sb).w;
            if (*(int *)&(ls->sb).e == (int)pcVar8) {
              pcVar8 = lj_buf_more2(sb,1);
            }
            *pcVar8 = (char)uVar3;
            (ls->sb).w = pcVar8 + 1;
            pbVar6 = (byte *)ls->p;
            if (pbVar6 < ls->pe) {
              ls->p = (char *)(pbVar6 + 1);
              uVar5 = (uint)*pbVar6;
            }
            else {
              uVar5 = lex_more(ls);
            }
            ls->c = uVar5;
            goto LAB_00145a82;
          }
          if (uVar3 == 0x2e) {
            pcVar8 = (ls->sb).w;
            if (*(int *)&(ls->sb).e == (int)pcVar8) {
              pcVar8 = lj_buf_more2(sb,1);
            }
            *pcVar8 = '.';
            (ls->sb).w = pcVar8 + 1;
            pbVar6 = (byte *)ls->p;
            if (pbVar6 < ls->pe) {
              ls->p = (char *)(pbVar6 + 1);
              uVar3 = (uint)*pbVar6;
            }
            else {
              uVar3 = lex_more(ls);
            }
            ls->c = uVar3;
            if (uVar3 == 0x2e) {
              pbVar6 = (byte *)ls->p;
              if (pbVar6 < ls->pe) {
                ls->p = (char *)(pbVar6 + 1);
                uVar3 = (uint)*pbVar6;
              }
              else {
                uVar3 = lex_more(ls);
              }
              ls->c = uVar3;
              if (uVar3 == 0x2e) {
                pbVar6 = (byte *)ls->p;
                if (pbVar6 < ls->pe) {
                  ls->p = (char *)(pbVar6 + 1);
                  uVar3 = (uint)*pbVar6;
                }
                else {
                  uVar3 = lex_more(ls);
                }
                ls->c = uVar3;
                return 0x118;
              }
              return 0x117;
            }
            if ((""[(long)(int)uVar3 + 1] & 8) == 0) {
              return 0x2e;
            }
            goto LAB_001461c6;
          }
          if (uVar3 == 0x5b) {
            iVar2 = lex_skipeq(ls);
            if (-1 < iVar2) {
              lex_longstring(ls,tv,iVar2);
              return 0x120;
            }
            if (iVar2 == -1) {
              return 0x5b;
            }
            tok = 0x120;
            em = LJ_ERR_XLDELIM;
            goto LAB_0014632b;
          }
          if (uVar3 == 0x7e) {
            pbVar6 = (byte *)ls->p;
            if (pbVar6 < ls->pe) {
              ls->p = (char *)(pbVar6 + 1);
              uVar3 = (uint)*pbVar6;
            }
            else {
              uVar3 = lex_more(ls);
            }
            ls->c = uVar3;
            if (uVar3 == 0x3d) {
              pbVar6 = (byte *)ls->p;
              if (pbVar6 < ls->pe) {
                ls->p = (char *)(pbVar6 + 1);
                uVar3 = (uint)*pbVar6;
              }
              else {
                uVar3 = lex_more(ls);
              }
              ls->c = uVar3;
              return 0x11c;
            }
            return 0x7e;
          }
switchD_00145914_caseD_3b:
          pbVar6 = (byte *)ls->p;
          if (pbVar6 < ls->pe) {
            ls->p = (char *)(pbVar6 + 1);
            uVar5 = (uint)*pbVar6;
          }
          else {
            uVar5 = lex_more(ls);
          }
          ls->c = uVar5;
          return uVar3;
        }
      }
      pbVar6 = (byte *)ls->p;
      if (pbVar6 < ls->pe) {
        ls->p = (char *)(pbVar6 + 1);
        uVar3 = (uint)*pbVar6;
      }
      else {
        uVar3 = lex_more(ls);
      }
      ls->c = uVar3;
      if (uVar3 != 0x2d) {
        return 0x2d;
      }
      pbVar6 = (byte *)ls->p;
      if (pbVar6 < ls->pe) {
        ls->p = (char *)(pbVar6 + 1);
        uVar3 = (uint)*pbVar6;
      }
      else {
        uVar3 = lex_more(ls);
      }
      ls->c = uVar3;
      if (uVar3 == 0x5b) {
        iVar2 = lex_skipeq(ls);
        (ls->sb).w = (ls->sb).b;
        if (-1 < iVar2) {
          lex_longstring(ls,(TValue *)0x0,iVar2);
          (ls->sb).w = (ls->sb).b;
          goto LAB_00145719;
        }
        uVar3 = ls->c;
      }
      while ((0xe < uVar3 + 1 || ((0x4801U >> (uVar3 + 1 & 0x1f) & 1) == 0))) {
        pbVar6 = (byte *)ls->p;
        if (pbVar6 < ls->pe) {
          ls->p = (char *)(pbVar6 + 1);
          uVar3 = (uint)*pbVar6;
        }
        else {
          uVar3 = lex_more(ls);
        }
        ls->c = uVar3;
      }
      goto LAB_00145719;
    }
    lex_newline(ls);
  } while( true );
LAB_00145a82:
  if (uVar5 == uVar3) {
    pcVar8 = (ls->sb).w;
    if (*(int *)&(ls->sb).e == (int)pcVar8) {
      pcVar8 = lj_buf_more2(sb,1);
    }
    *pcVar8 = (char)uVar3;
    pcVar8 = pcVar8 + 1;
    (ls->sb).w = pcVar8;
    pbVar6 = (byte *)ls->p;
    if (pbVar6 < ls->pe) {
      ls->p = (char *)(pbVar6 + 1);
      uVar3 = (uint)*pbVar6;
    }
    else {
      uVar3 = lex_more(ls);
      pcVar8 = (ls->sb).w;
    }
    ls->c = uVar3;
    pcVar1 = (ls->sb).b;
    pGVar7 = lj_parse_keepstr(ls,pcVar1 + 1,(ulong)(((int)pcVar8 - (int)pcVar1) - 2));
    tv->u64 = (ulong)pGVar7 | 0xfffd800000000000;
    return 0x120;
  }
  if (uVar5 != 0x5c) {
    if ((uVar5 == 0xd) || (uVar5 == 10)) {
      tok = 0x120;
    }
    else {
      if (uVar5 != 0xffffffff) {
        pcVar8 = (ls->sb).w;
        if (*(int *)&(ls->sb).e == (int)pcVar8) {
          pcVar8 = lj_buf_more2(sb,1);
        }
        *pcVar8 = (char)uVar5;
        (ls->sb).w = pcVar8 + 1;
        pbVar6 = (byte *)ls->p;
        if (pbVar6 < ls->pe) {
          ls->p = (char *)(pbVar6 + 1);
          uVar5 = (uint)*pbVar6;
        }
        else {
          uVar5 = lex_more(ls);
        }
        ls->c = uVar5;
        goto LAB_00145a82;
      }
      tok = 0x121;
    }
    em = LJ_ERR_XSTR;
LAB_0014632b:
    lj_lex_error(ls,tok,em);
  }
  pbVar6 = (byte *)ls->p;
  if (pbVar6 < ls->pe) {
    ls->p = (char *)(pbVar6 + 1);
    uVar5 = (uint)*pbVar6;
  }
  else {
    uVar5 = lex_more(ls);
  }
  ls->c = uVar5;
  switch(uVar5) {
  case 0x6e:
    uVar5 = 10;
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x77:
  case 0x79:
switchD_00145b92_caseD_6f:
    if ((""[(long)(int)uVar5 + 1] & 8) != 0) {
      pbVar6 = (byte *)ls->p;
      if (pbVar6 < ls->pe) {
        ls->p = (char *)(pbVar6 + 1);
        uVar4 = (uint)*pbVar6;
      }
      else {
        uVar4 = lex_more(ls);
      }
      iVar2 = uVar5 - 0x30;
      ls->c = uVar4;
      if ((""[(long)(int)uVar4 + 1] & 8) != 0) {
        pbVar6 = (byte *)ls->p;
        if (pbVar6 < ls->pe) {
          ls->p = (char *)(pbVar6 + 1);
          uVar5 = (uint)*pbVar6;
        }
        else {
          uVar5 = lex_more(ls);
        }
        iVar2 = iVar2 * 10 + uVar4 + -0x30;
        ls->c = uVar5;
        if ((""[(long)(int)uVar5 + 1] & 8) != 0) {
          iVar2 = iVar2 * 10 + uVar5 + -0x30;
          if (0xff < iVar2) goto LAB_00146305;
          pbVar6 = (byte *)ls->p;
          if (pbVar6 < ls->pe) {
            ls->p = (char *)(pbVar6 + 1);
            uVar5 = (uint)*pbVar6;
          }
          else {
            uVar5 = lex_more(ls);
          }
          ls->c = uVar5;
        }
      }
      pcVar8 = (ls->sb).w;
      if (*(int *)&(ls->sb).e == (int)pcVar8) {
        pcVar8 = lj_buf_more2(sb,1);
      }
      *pcVar8 = (char)iVar2;
      sb->w = pcVar8 + 1;
      goto LAB_00145cbf;
    }
LAB_00146305:
    tok = 0x120;
    em = LJ_ERR_XESC;
    goto LAB_0014632b;
  case 0x72:
    uVar5 = 0xd;
    break;
  case 0x74:
    uVar5 = 9;
    break;
  case 0x75:
    pbVar6 = (byte *)ls->p;
    if (pbVar6 < ls->pe) {
      ls->p = (char *)(pbVar6 + 1);
      uVar5 = (uint)*pbVar6;
    }
    else {
      uVar5 = lex_more(ls);
    }
    ls->c = uVar5;
    if (uVar5 != 0x7b) goto LAB_00146305;
    pbVar6 = (byte *)ls->p;
    if (pbVar6 < ls->pe) {
      ls->p = (char *)(pbVar6 + 1);
      uVar4 = (uint)*pbVar6;
    }
    else {
      uVar4 = lex_more(ls);
    }
    ls->c = uVar4;
    uVar5 = 0;
    do {
      uVar5 = uVar4 & 0xf | uVar5 << 4;
      if ((""[(long)(int)uVar4 + 1] & 8) == 0) {
        if ((""[(long)(int)uVar4 + 1] & 0x10) == 0) goto LAB_00146305;
        uVar5 = uVar5 + 9;
      }
      if (0x10ffff < (int)uVar5) goto LAB_00146305;
      pbVar6 = (byte *)ls->p;
      if (pbVar6 < ls->pe) {
        ls->p = (char *)(pbVar6 + 1);
        uVar4 = (uint)*pbVar6;
      }
      else {
        uVar4 = lex_more(ls);
      }
      ls->c = uVar4;
    } while (uVar4 != 0x7d);
    if ((int)uVar5 < 0x800) {
      if ((int)uVar5 < 0x80) break;
      pbVar6 = (byte *)(ls->sb).w;
      if (*(int *)&(ls->sb).e == (int)pbVar6) {
        pbVar6 = (byte *)lj_buf_more2(sb,1);
      }
      *pbVar6 = (byte)(uVar5 >> 6) | 0xc0;
    }
    else {
      if (uVar5 < 0x10000) {
        if ((uVar5 & 0xf800) == 0xd800) goto LAB_00146305;
        pbVar6 = (byte *)(ls->sb).w;
        if (*(int *)&(ls->sb).e == (int)pbVar6) {
          pbVar6 = (byte *)lj_buf_more2(sb,1);
        }
        bVar9 = (byte)(uVar5 >> 0xc) | 0xe0;
      }
      else {
        pbVar6 = (byte *)(ls->sb).w;
        if (*(int *)&(ls->sb).e == (int)pbVar6) {
          pbVar6 = (byte *)lj_buf_more2(sb,1);
        }
        *pbVar6 = (byte)(uVar5 >> 0x12) | 0xf0;
        pbVar6 = pbVar6 + 1;
        (ls->sb).w = (char *)pbVar6;
        if (*(int *)&(ls->sb).e == (int)pbVar6) {
          pbVar6 = (byte *)lj_buf_more2(sb,1);
        }
        bVar9 = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
      }
      *pbVar6 = bVar9;
      pbVar6 = pbVar6 + 1;
      (ls->sb).w = (char *)pbVar6;
      if (*(int *)&(ls->sb).e == (int)pbVar6) {
        pbVar6 = (byte *)lj_buf_more2(sb,1);
      }
      *pbVar6 = (byte)(uVar5 >> 6) & 0x3f | 0x80;
    }
    sb->w = (char *)(pbVar6 + 1);
    uVar5 = uVar5 & 0x3f | 0x80;
    break;
  case 0x76:
    uVar5 = 0xb;
    break;
  case 0x78:
    pbVar6 = (byte *)ls->p;
    if (pbVar6 < ls->pe) {
      ls->p = (char *)(pbVar6 + 1);
      uVar5 = (uint)*pbVar6;
    }
    else {
      uVar5 = lex_more(ls);
    }
    ls->c = uVar5;
    iVar2 = (uVar5 & 0xf) * 0x10;
    if ((""[(long)(int)uVar5 + 1] & 8) == 0) {
      if ((""[(long)(int)uVar5 + 1] & 0x10) == 0) goto LAB_00146305;
      iVar2 = iVar2 + 0x90;
    }
    pbVar6 = (byte *)ls->p;
    if (pbVar6 < ls->pe) {
      ls->p = (char *)(pbVar6 + 1);
      uVar4 = (uint)*pbVar6;
    }
    else {
      uVar4 = lex_more(ls);
    }
    ls->c = uVar4;
    uVar5 = (uVar4 & 0xf) + iVar2;
    if ((""[(long)(int)uVar4 + 1] & 8) == 0) {
      if ((""[(long)(int)uVar4 + 1] & 0x10) == 0) goto LAB_00146305;
      uVar5 = uVar5 + 9;
    }
    break;
  case 0x7a:
    do {
      pbVar6 = (byte *)ls->p;
      if (pbVar6 < ls->pe) {
        ls->p = (char *)(pbVar6 + 1);
        uVar5 = (uint)*pbVar6;
      }
      else {
        uVar5 = lex_more(ls);
      }
      ls->c = uVar5;
      while( true ) {
        if ((""[(long)(int)uVar5 + 1] & 2) == 0) goto LAB_00145cbf;
        if ((uVar5 != 0xd) && (uVar5 != 10)) break;
        lex_newline(ls);
        uVar5 = ls->c;
      }
    } while( true );
  default:
    if (uVar5 != 0xffffffff) {
      if ((uVar5 != 10) && (uVar5 != 0xd)) {
        if ((uVar5 != 0x22) && ((uVar5 != 0x27 && (uVar5 != 0x5c)))) {
          if (uVar5 == 0x66) {
            uVar5 = 0xc;
          }
          else if (uVar5 == 0x62) {
            uVar5 = 8;
          }
          else {
            if (uVar5 != 0x61) goto switchD_00145b92_caseD_6f;
            uVar5 = 7;
          }
        }
        break;
      }
      pcVar8 = (ls->sb).w;
      if (*(int *)&(ls->sb).e == (int)pcVar8) {
        pcVar8 = lj_buf_more2(sb,1);
      }
      *pcVar8 = '\n';
      (ls->sb).w = pcVar8 + 1;
      lex_newline(ls);
    }
    goto LAB_00145cbf;
  }
  pcVar8 = (ls->sb).w;
  if (*(int *)&(ls->sb).e == (int)pcVar8) {
    pcVar8 = lj_buf_more2(sb,1);
  }
  *pcVar8 = (char)uVar5;
  (ls->sb).w = pcVar8 + 1;
  pbVar6 = (byte *)ls->p;
  if (pbVar6 < ls->pe) {
    ls->p = (char *)(pbVar6 + 1);
    uVar5 = (uint)*pbVar6;
  }
  else {
    uVar5 = lex_more(ls);
  }
  ls->c = uVar5;
LAB_00145cbf:
  uVar5 = ls->c;
  goto LAB_00145a82;
}

Assistant:

static LexToken lex_scan(LexState *ls, TValue *tv)
{
  lj_buf_reset(&ls->sb);
  for (;;) {
    if (lj_char_isident(ls->c)) {
      GCstr *s;
      if (lj_char_isdigit(ls->c)) {  /* Numeric literal. */
	lex_number(ls, tv);
	return TK_number;
      }
      /* Identifier or reserved word. */
      do {
	lex_savenext(ls);
      } while (lj_char_isident(ls->c));
      s = lj_parse_keepstr(ls, ls->sb.b, sbuflen(&ls->sb));
      setstrV(ls->L, tv, s);
      if (s->reserved > 0)  /* Reserved word? */
	return TK_OFS + s->reserved;
      return TK_name;
    }
    switch (ls->c) {
    case '\n':
    case '\r':
      lex_newline(ls);
      continue;
    case ' ':
    case '\t':
    case '\v':
    case '\f':
      lex_next(ls);
      continue;
    case '-':
      lex_next(ls);
      if (ls->c != '-') return '-';
      lex_next(ls);
      if (ls->c == '[') {  /* Long comment "--[=*[...]=*]". */
	int sep = lex_skipeq(ls);
	lj_buf_reset(&ls->sb);  /* `lex_skipeq' may dirty the buffer */
	if (sep >= 0) {
	  lex_longstring(ls, NULL, sep);
	  lj_buf_reset(&ls->sb);
	  continue;
	}
      }
      /* Short comment "--.*\n". */
      while (!lex_iseol(ls) && ls->c != LEX_EOF)
	lex_next(ls);
      continue;
    case '[': {
      int sep = lex_skipeq(ls);
      if (sep >= 0) {
	lex_longstring(ls, tv, sep);
	return TK_string;
      } else if (sep == -1) {
	return '[';
      } else {
	lj_lex_error(ls, TK_string, LJ_ERR_XLDELIM);
	continue;
      }
      }
    case '=':
      lex_next(ls);
      if (ls->c != '=') return '='; else { lex_next(ls); return TK_eq; }
    case '<':
      lex_next(ls);
      if (ls->c != '=') return '<'; else { lex_next(ls); return TK_le; }
    case '>':
      lex_next(ls);
      if (ls->c != '=') return '>'; else { lex_next(ls); return TK_ge; }
    case '~':
      lex_next(ls);
      if (ls->c != '=') return '~'; else { lex_next(ls); return TK_ne; }
    case ':':
      lex_next(ls);
      if (ls->c != ':') return ':'; else { lex_next(ls); return TK_label; }
    case '"':
    case '\'':
      lex_string(ls, tv);
      return TK_string;
    case '.':
      if (lex_savenext(ls) == '.') {
	lex_next(ls);
	if (ls->c == '.') {
	  lex_next(ls);
	  return TK_dots;   /* ... */
	}
	return TK_concat;   /* .. */
      } else if (!lj_char_isdigit(ls->c)) {
	return '.';
      } else {
	lex_number(ls, tv);
	return TK_number;
      }
    case LEX_EOF:
      return TK_eof;
    default: {
      LexChar c = ls->c;
      lex_next(ls);
      return c;  /* Single-char tokens (+ - / ...). */
    }
    }
  }
}